

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O1

void __thiscall
SCCLiveness::ProcessStackSymUse(SCCLiveness *this,StackSym *stackSym,Instr *instr,int usageSize)

{
  Lifetime *lifetime;
  code *pcVar1;
  bool bVar2;
  uint newUseValue;
  JITTimeFunctionBody *this_00;
  char16 *pcVar3;
  FunctionJITTimeInfo *this_01;
  char16 *pcVar4;
  undefined4 *puVar5;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  lifetime = *(Lifetime **)&(stackSym->scratch).globOpt;
  if (lifetime == (Lifetime *)0x0) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar3 = JITTimeFunctionBody::GetDisplayName(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar4 = FunctionJITTimeInfo::GetDebugNumberSet(this_01,(wchar (*) [42])local_88);
    Output::Print(L"Function: %s (%s)       ",pcVar3,pcVar4);
    Output::Print(L"Reg: ");
    Sym::Dump(&stackSym->super_Sym,(ValueType)0x9);
    Output::Print(L"\n");
    Output::Flush();
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x23a,"((0))","Uninitialized reg?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  else {
    if (lifetime->region != this->curRegion) {
      bVar2 = Func::DoOptimizeTry(this->func);
      if (!bVar2) {
        lifetime->field_0x9d = lifetime->field_0x9d | 1;
      }
    }
    ExtendLifetime(this,lifetime,instr);
  }
  newUseValue = LinearScan::GetUseSpillCost
                          ((uint)this->loopNest,(uint)(this->lastOpHelperLabel != (LabelInstr *)0x0)
                          );
  Lifetime::AddToUseCount(lifetime,newUseValue,this->curLoop,this->func);
  if (lifetime->start < this->lastCall) {
    lifetime->field_0x9c = lifetime->field_0x9c | 2;
  }
  if (lifetime->start < this->lastNonOpHelperCall) {
    lifetime->field_0x9c = lifetime->field_0x9c | 4;
  }
  lifetime->field_0x9c = lifetime->field_0x9c & 0xf7;
  BVUnitT<unsigned_long>::AssertRange(usageSize);
  (lifetime->intUsageBv).word = (lifetime->intUsageBv).word | 1L << ((byte)usageSize & 0x3f);
  return;
}

Assistant:

void
SCCLiveness::ProcessStackSymUse(StackSym * stackSym, IR::Instr * instr, int usageSize)
{
    Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;

    if (lifetime == nullptr)
    {
#if DBG
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Function: %s (%s)       "), this->func->GetJITFunctionBody()->GetDisplayName(), this->func->GetDebugNumberSet(debugStringBuffer));
        Output::Print(_u("Reg: "));
        stackSym->Dump();
        Output::Print(_u("\n"));
        Output::Flush();
#endif
        AnalysisAssertMsg(UNREACHED, "Uninitialized reg?");
    }
    else
    {
        if (lifetime->region != this->curRegion && !this->func->DoOptimizeTry())
        {
            lifetime->dontAllocate = true;
        }

        ExtendLifetime(lifetime, instr);
    }
    lifetime->AddToUseCount(LinearScan::GetUseSpillCost(this->loopNest, (this->lastOpHelperLabel != nullptr)), this->curLoop, this->func);
    if (lifetime->start < this->lastCall)
    {
        lifetime->isLiveAcrossCalls = true;
    }
    if (lifetime->start < this->lastNonOpHelperCall)
    {
        lifetime->isLiveAcrossUserCalls = true;
    }
    lifetime->isDeadStore = false;

    lifetime->intUsageBv.Set(usageSize);
}